

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

double * __thiscall
google::protobuf::internal::UntypedMapBase::GetValue<double>(UntypedMapBase *this,NodeBase *node)

{
  Nullable<const_char_*> failure_msg;
  LogMessageFatal local_20;
  
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                          (4,(uint)((byte)(this->type_info_).field_0x3 >> 4),
                           "static_cast<int>(StaticTypeKind<T>()) == static_cast<int>(type_info_.value_type)"
                          );
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return (double *)((long)&node->next + (ulong)(this->type_info_).value_offset);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x152,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

T* GetValue(NodeBase* node) const {
    // Debug check that `T` matches what we expect from the type info.
    ABSL_DCHECK_EQ(static_cast<int>(StaticTypeKind<T>()),
                   static_cast<int>(type_info_.value_type));
    return reinterpret_cast<T*>(GetVoidValue(node));
  }